

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

void __thiscall kj::Exception::Exception(Exception *this,Exception *other)

{
  size_t sVar1;
  ArrayDisposer *pAVar2;
  Context *pCVar3;
  Disposer *pDVar4;
  Type TVar5;
  Context *this_00;
  uint uVar6;
  char *size;
  char *pcVar7;
  size_t size_00;
  char *pcVar8;
  String local_30;
  
  (this->ownFile).content.ptr = (char *)0x0;
  (this->ownFile).content.size_ = 0;
  (this->ownFile).content.disposer = (ArrayDisposer *)0x0;
  this->file = other->file;
  TVar5 = other->type;
  this->line = other->line;
  this->type = TVar5;
  pcVar8 = (char *)(other->description).content.size_;
  pcVar7 = pcVar8;
  if (pcVar8 != (char *)0x0) {
    pcVar7 = (other->description).content.ptr;
  }
  size = pcVar8 + -1;
  if (pcVar8 == (char *)0x0) {
    size = (char *)0x0;
  }
  heapString(&this->description,pcVar7,(size_t)size);
  (this->context).ptr.disposer = (Disposer *)0x0;
  (this->context).ptr.ptr = (Context *)0x0;
  uVar6 = other->traceCount;
  this->traceCount = uVar6;
  pcVar8 = (other->ownFile).content.ptr;
  sVar1 = (other->ownFile).content.size_;
  pcVar7 = pcVar8;
  if (sVar1 == 0) {
    pcVar7 = "";
  }
  if (this->file == pcVar7) {
    if (sVar1 == 0) {
      pcVar8 = (char *)0x0;
    }
    size_00 = 0;
    if (sVar1 != 0) {
      size_00 = sVar1 - 1;
    }
    heapString(&local_30,pcVar8,size_00);
    pcVar8 = (this->ownFile).content.ptr;
    if (pcVar8 != (char *)0x0) {
      sVar1 = (this->ownFile).content.size_;
      pAVar2 = (this->ownFile).content.disposer;
      (this->ownFile).content.ptr = (char *)0x0;
      (this->ownFile).content.size_ = 0;
      (**pAVar2->_vptr_ArrayDisposer)(pAVar2,pcVar8,1,sVar1,sVar1,0);
    }
    (this->ownFile).content.ptr = local_30.content.ptr;
    (this->ownFile).content.size_ = local_30.content.size_;
    (this->ownFile).content.disposer = local_30.content.disposer;
    pcVar8 = "";
    if (local_30.content.size_ != 0) {
      pcVar8 = local_30.content.ptr;
    }
    this->file = pcVar8;
    uVar6 = this->traceCount;
  }
  memcpy(this->trace,other->trace,(ulong)uVar6 << 3);
  pCVar3 = (other->context).ptr.ptr;
  if (pCVar3 != (Context *)0x0) {
    this_00 = (Context *)operator_new(0x38);
    Context::Context(this_00,pCVar3);
    pDVar4 = (this->context).ptr.disposer;
    pCVar3 = (this->context).ptr.ptr;
    (this->context).ptr.disposer = (Disposer *)&_::HeapDisposer<kj::Exception::Context>::instance;
    (this->context).ptr.ptr = this_00;
    if (pCVar3 != (Context *)0x0) {
      (**pDVar4->_vptr_Disposer)();
    }
  }
  return;
}

Assistant:

Exception::Exception(const Exception& other) noexcept
    : file(other.file), line(other.line), type(other.type),
      description(heapString(other.description)), traceCount(other.traceCount) {
  if (file == other.ownFile.cStr()) {
    ownFile = heapString(other.ownFile);
    file = ownFile.cStr();
  }

  memcpy(trace, other.trace, sizeof(trace[0]) * traceCount);

  KJ_IF_MAYBE(c, other.context) {
    context = heap(**c);
  }
}